

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

int json_integer_option(lua_State *l,int optindex,int *setting,int min,int max)

{
  int iVar1;
  int extraout_EAX;
  lua_Integer lVar2;
  char errmsg [64];
  char acStack_68 [64];
  
  iVar1 = lua_type(l,optindex);
  if (iVar1 == 0) {
    iVar1 = *setting;
  }
  else {
    lVar2 = luaL_checkinteger(l,optindex);
    iVar1 = (int)lVar2;
    snprintf(acStack_68,0x40,"expected integer between %d and %d",(ulong)(uint)min,max);
    if (iVar1 < min || max < iVar1) {
      luaL_argerror(l,1,acStack_68);
    }
    *setting = iVar1;
  }
  lua_pushinteger(l,(long)iVar1);
  return extraout_EAX;
}

Assistant:

static int json_integer_option(lua_State *l, int optindex, int *setting,
                               int min, int max)
{
    char errmsg[64];
    int value;

    if (!lua_isnil(l, optindex)) {
        value = luaL_checkinteger(l, optindex);
        snprintf(errmsg, sizeof(errmsg), "expected integer between %d and %d", min, max);
        luaL_argcheck(l, min <= value && value <= max, 1, errmsg);
        *setting = value;
    }

    lua_pushinteger(l, *setting);

    return 1;
}